

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__texture_env_color
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  texture_env_color__AttributeData *ptVar2;
  StringHash SVar3;
  uint64 uVar4;
  long *in_RSI;
  ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
  *in_RDI;
  bool failed_1;
  bool failed;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  texture_env_color__AttributeData *attributeData;
  ParserChar *in_stack_00000078;
  ParserChar *in_stack_00000080;
  StringHash in_stack_00000088;
  ErrorType in_stack_00000090;
  Severity in_stack_00000094;
  ParserTemplateBase *in_stack_00000098;
  void **in_stack_ffffffffffffff98;
  ParserTemplateBase *in_stack_ffffffffffffffa0;
  undefined6 in_stack_ffffffffffffffa8;
  byte in_stack_ffffffffffffffae;
  byte in_stack_ffffffffffffffaf;
  ParserChar *elementHash;
  ParserTemplateBase *this_00;
  undefined8 *local_38;
  bool local_1;
  
  ptVar2 = GeneratedSaxParser::ParserTemplateBase::
           newData<COLLADASaxFWL14::texture_env_color__AttributeData>
                     (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_38 = (undefined8 *)*in_RSI;
  if (local_38 == (undefined8 *)0x0) {
LAB_0089678c:
    if ((ptVar2->present_attributes & 1) == 0) {
      GeneratedSaxParser::XSList<float>::XSList((XSList<float> *)&stack0xffffffffffffff98);
      (ptVar2->value).data = (float *)in_stack_ffffffffffffff98;
      (ptVar2->value).size = (size_t)in_stack_ffffffffffffffa0;
    }
    local_1 = true;
  }
  else {
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            this_00 = (ParserTemplateBase *)*local_38;
            if (this_00 == (ParserTemplateBase *)0x0) goto LAB_0089678c;
            SVar3 = GeneratedSaxParser::Utils::calculateStringHash((ParserChar *)this_00);
            if (local_38 + 1 == (undefined8 *)0x0) {
              return false;
            }
            elementHash = (ParserChar *)local_38[1];
            local_38 = local_38 + 2;
            if (SVar3 != 0x704ac8) break;
            uVar4 = GeneratedSaxParser::Utils::toUint64
                              ((ParserChar *)in_RDI,(bool *)(__DT_RELA + 0x169b5));
            ptVar2->index = uVar4;
            if (((in_stack_ffffffffffffffae & 1) != 0) &&
               (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                  (this_00,(Severity)(SVar3 >> 0x20),(ErrorType)SVar3,
                                   (StringHash)elementHash,
                                   CONCAT17(in_stack_ffffffffffffffaf,
                                            CONCAT16(in_stack_ffffffffffffffae,
                                                     in_stack_ffffffffffffffa8)),
                                   (ParserChar *)in_stack_ffffffffffffffa0), bVar1)) {
              return false;
            }
            if ((in_stack_ffffffffffffffae & 1) == 0) {
              ptVar2->present_attributes = ptVar2->present_attributes | 2;
            }
          }
          if (SVar3 != 0x76887d) break;
          ptVar2->param = elementHash;
        }
        if (SVar3 != 0x7c83b5) break;
        bVar1 = GeneratedSaxParser::
                ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                ::characterData2FloatList(in_RDI,(ParserChar *)0x7c83b5,(XSList<float> *)0x896683);
        in_stack_ffffffffffffffaf = (bVar1 ^ 0xffU) & 1;
        if ((in_stack_ffffffffffffffaf != 0) &&
           (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              (this_00,(Severity)(SVar3 >> 0x20),(ErrorType)SVar3,
                               (StringHash)elementHash,
                               (CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffffae,
                                                        in_stack_ffffffffffffffa8)) ^
                               0xff00000000000000) & 0x1ffffffffffffff,
                               (ParserChar *)in_stack_ffffffffffffffa0), bVar1)) {
          return false;
        }
        if ((in_stack_ffffffffffffffaf & 1) == 0) {
          ptVar2->present_attributes = ptVar2->present_attributes | 1;
        }
      }
      bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (in_stack_00000098,in_stack_00000094,in_stack_00000090,in_stack_00000088,
                         in_stack_00000080,in_stack_00000078);
    } while (!bVar1);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__texture_env_color( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__texture_env_color( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

texture_env_color__AttributeData* attributeData = newData<texture_env_color__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_value:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2FloatList(attributeValue, attributeData->value, 0, HASH_ELEMENT_TEXTURE_ENV_COLOR, HASH_ATTRIBUTE_value);
    }
    else
    {
failed = !characterData2FloatList(attributeValue, attributeData->value);
    }
#else
    {
failed = !characterData2FloatList(attributeValue, attributeData->value);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_TEXTURE_ENV_COLOR,
        HASH_ATTRIBUTE_value,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__float4(attributeData->value.data, attributeData->value.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_TEXTURE_ENV_COLOR,
            HASH_ATTRIBUTE_value,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= texture_env_color__AttributeData::ATTRIBUTE_VALUE_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_param:
    {

attributeData->param = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->param, strlen(attributeData->param));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_TEXTURE_ENV_COLOR,
            HASH_ATTRIBUTE_param,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    case HASH_ATTRIBUTE_index:
    {
bool failed;
attributeData->index = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_TEXTURE_ENV_COLOR,
        HASH_ATTRIBUTE_index,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= texture_env_color__AttributeData::ATTRIBUTE_INDEX_PRESENT;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_TEXTURE_ENV_COLOR, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ((attributeData->present_attributes & texture_env_color__AttributeData::ATTRIBUTE_VALUE_PRESENT) == 0)
{
    attributeData->value = GeneratedSaxParser::XSList<float>();
}


    return true;
}